

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

int wally_hex_verify(char *hex)

{
  int iVar1;
  undefined8 local_20;
  char *hex_local;
  
  if (hex == (char *)0x0) {
    local_20 = 0;
  }
  else {
    local_20 = strlen(hex);
  }
  iVar1 = wally_hex_n_verify(hex,local_20);
  return iVar1;
}

Assistant:

int wally_hex_verify(const char *hex)
{
    return wally_hex_n_verify(hex, hex ? strlen(hex) : 0);
}